

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

void __thiscall
google::protobuf::FeatureSet_VisibilityFeature::~FeatureSet_VisibilityFeature
          (FeatureSet_VisibilityFeature *this)

{
  internal::ZeroFieldsBase::~ZeroFieldsBase(&this->super_ZeroFieldsBase);
  operator_delete(this,0x18);
  return;
}

Assistant:

class PROTOBUF_EXPORT FeatureSet_VisibilityFeature final : public ::google::protobuf::internal::ZeroFieldsBase
/* @@protoc_insertion_point(class_definition:google.protobuf.FeatureSet.VisibilityFeature) */ {
 public:
  inline FeatureSet_VisibilityFeature() : FeatureSet_VisibilityFeature(nullptr) {}

#if defined(PROTOBUF_CUSTOM_VTABLE)
  void operator delete(FeatureSet_VisibilityFeature* PROTOBUF_NONNULL msg, std::destroying_delete_t) {
    SharedDtor(*msg);
    ::google::protobuf::internal::SizedDelete(msg, sizeof(FeatureSet_VisibilityFeature));
  }
#endif

  template <typename = void>
  explicit PROTOBUF_CONSTEXPR FeatureSet_VisibilityFeature(::google::protobuf::internal::ConstantInitialized);

  inline FeatureSet_VisibilityFeature(const FeatureSet_VisibilityFeature& from) : FeatureSet_VisibilityFeature(nullptr, from) {}
  inline FeatureSet_VisibilityFeature(FeatureSet_VisibilityFeature&& from) noexcept
      : FeatureSet_VisibilityFeature(nullptr, ::std::move(from)) {}
  inline FeatureSet_VisibilityFeature& operator=(const FeatureSet_VisibilityFeature& from) {
    CopyFrom(from);
    return *this;
  }
  inline FeatureSet_VisibilityFeature& operator=(FeatureSet_VisibilityFeature&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }

  inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return _internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance);
  }
  inline ::google::protobuf::UnknownFieldSet* PROTOBUF_NONNULL mutable_unknown_fields()
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return _internal_metadata_.mutable_unknown_fields<::google::protobuf::UnknownFieldSet>();
  }

  static const ::google::protobuf::Descriptor* PROTOBUF_NONNULL descriptor() {
    return GetDescriptor();
  }
  static const ::google::protobuf::Descriptor* PROTOBUF_NONNULL GetDescriptor() {
    return default_instance().GetMetadata().descriptor;
  }
  static const ::google::protobuf::Reflection* PROTOBUF_NONNULL GetReflection() {
    return default_instance().GetMetadata().reflection;
  }
  static const FeatureSet_VisibilityFeature& default_instance() {
    return *reinterpret_cast<const FeatureSet_VisibilityFeature*>(
        &_FeatureSet_VisibilityFeature_default_instance_);
  }
  static constexpr int kIndexInFileMessages = 26;
  friend void swap(FeatureSet_VisibilityFeature& a, FeatureSet_VisibilityFeature& b) { a.Swap(&b); }
  inline void Swap(FeatureSet_VisibilityFeature* PROTOBUF_NONNULL other) {
    if (other == this) return;
    if (::google::protobuf::internal::CanUseInternalSwap(GetArena(), other->GetArena())) {
      InternalSwap(other);
    } else {
      ::google::protobuf::internal::GenericSwap(this, other);
    }
  }
  void UnsafeArenaSwap(FeatureSet_VisibilityFeature* PROTOBUF_NONNULL other) {
    if (other == this) return;
    ABSL_DCHECK(GetArena() == other->GetArena());
    InternalSwap(other);
  }

  // implements Message ----------------------------------------------

  FeatureSet_VisibilityFeature* PROTOBUF_NONNULL New(::google::protobuf::Arena* PROTOBUF_NULLABLE arena = nullptr) const {
    return ::google::protobuf::internal::ZeroFieldsBase::DefaultConstruct<FeatureSet_VisibilityFeature>(arena);
  }